

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.cc
# Opt level: O2

int Quantize(void *hPtr,char *output,TrainingArgs trainArgs,char *label)

{
  AutotuneArgs autotuneArgs;
  bool bVar1;
  long lVar2;
  int iVar3;
  TrainingArgs *pTVar4;
  _Any_data *this;
  undefined1 *puVar5;
  byte bVar6;
  TrainingArgs in_stack_fffffffffffffd38;
  _Any_data local_228;
  undefined8 local_218;
  undefined8 uStack_210;
  string outPath;
  int local_1c8;
  Args args;
  
  bVar6 = 0;
  bVar1 = IsModelReady(hPtr);
  if (!bVar1) {
LAB_0014e8c8:
    std::__cxx11::string::assign((char *)&_lastError_abi_cxx11_);
    return -1;
  }
  fasttext::FastText::getArgs(&args,(FastText *)hPtr);
  fasttext::Args::~Args(&args);
  if ((args.model != sup) || (output == (char *)0x0)) goto LAB_0014e8c8;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&outPath,output,(allocator<char> *)&args);
  if (outPath._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&_lastError_abi_cxx11_);
    iVar3 = -1;
    goto LAB_0014ea51;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&args,".bin",(allocator<char> *)local_228._M_pod_data);
  bVar1 = EndsWith(&outPath,(string *)&args,true);
  std::__cxx11::string::~string((string *)&args);
  if (bVar1) {
    std::__cxx11::string::substr((ulong)&local_228,(ulong)&outPath);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_228,
                   ".ftz");
    std::__cxx11::string::operator=((string *)&outPath,(string *)&args);
    std::__cxx11::string::~string((string *)&args);
    this = &local_228;
LAB_0014e97c:
    std::__cxx11::string::~string((string *)this->_M_pod_data);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&args,".ftz",(allocator<char> *)local_228._M_pod_data);
    bVar1 = EndsWith(&outPath,(string *)&args,true);
    std::__cxx11::string::~string((string *)&args);
    if (!bVar1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                     &outPath,".ftz");
      this = (_Any_data *)&args;
      std::__cxx11::string::operator=((string *)&outPath,(string *)this->_M_pod_data);
      goto LAB_0014e97c;
    }
  }
  pTVar4 = &trainArgs;
  puVar5 = &stack0xfffffffffffffd38;
  for (lVar2 = 100; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar5 = *(undefined1 *)&pTVar4->lr;
    pTVar4 = (TrainingArgs *)((long)pTVar4 + (ulong)bVar6 * -2 + 1);
    puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
  }
  autotuneArgs.metric = "f1";
  autotuneArgs.validationFile = "";
  autotuneArgs.predictions = 1;
  autotuneArgs.duration = 300;
  autotuneArgs.modelSize = "";
  autotuneArgs.verbose = local_1c8;
  CreateArgs(&args,in_stack_fffffffffffffd38,autotuneArgs,label,(char *)0x0);
  local_218 = 0;
  uStack_210 = 0;
  local_228._M_unused._M_object = (void *)0x0;
  local_228._8_8_ = 0;
  fasttext::FastText::quantize((FastText *)hPtr,&args,(TrainCallback *)&local_228);
  std::_Function_base::~_Function_base((_Function_base *)&local_228);
  iVar3 = 0;
  fasttext::FastText::saveModel((FastText *)hPtr,&outPath);
  fasttext::Args::~Args(&args);
LAB_0014ea51:
  std::__cxx11::string::~string((string *)&outPath);
  return iVar3;
}

Assistant:

Quantize(void* hPtr, const char* output, TrainingArgs trainArgs, const char* label)
{
    if (!IsModelReady(hPtr))
    {
        _lastError = "Model is not ready!";
        return -1;
    }

    auto fastText = static_cast<FastTextWrapper*>(hPtr);
    if (fastText->getArgs().model != model_name::sup)
    {
        _lastError = "Only supervised models can be quantized!";
        return -1;
    }

    if (output == nullptr)
    {
        _lastError = "Output is not specified!";
        return -1;
    }

    auto outPath = std::string(output);
    if (outPath.empty())
    {
        _lastError = "Output is not specified!";
        return -1;
    }

    if (EndsWith(outPath, ".bin", true))
        outPath = outPath.substr(0, outPath.length() - 4) + ".ftz";
    else if (!EndsWith(outPath, ".ftz", true))
        outPath = outPath + ".ftz";

    auto args = CreateArgs(trainArgs, AutotuneArgs(), label, nullptr);

    try {
        fastText->quantize(args);
        fastText->saveModel(outPath);

        return 0;
    }
    catch (std::exception& e) {
        _lastError = std::string(e.what());
        return -1;
    }
    catch (...) {
        _lastError = "Unknown error";
        return -1;
    }
}